

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void softHSMLog(int loglevel,char *functionName,char *fileName,int lineNo,char *format,...)

{
  char in_AL;
  ostream *poVar1;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vector<char,_std::allocator<char>_> logMessage;
  va_list args;
  stringstream prepend;
  _Vector_base<char,_std::allocator<char>_> local_2c8;
  undefined8 local_2a8 [4];
  undefined8 local_288;
  pointer *local_280;
  undefined1 *local_278;
  undefined1 local_268 [40];
  undefined8 local_240;
  undefined4 local_238;
  undefined8 local_228;
  undefined8 local_218;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  if (in_AL != '\0') {
    local_238 = in_XMM0_Da;
    local_228 = in_XMM1_Qa;
    local_218 = in_XMM2_Qa;
    local_208 = in_XMM3_Qa;
    local_1f8 = in_XMM4_Qa;
    local_1e8 = in_XMM5_Qa;
    local_1d8 = in_XMM6_Qa;
    local_1c8 = in_XMM7_Qa;
  }
  if (loglevel <= softLogLevel) {
    local_240 = in_R9;
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar1 = std::operator<<(local_1a0,fileName);
    poVar1 = std::operator<<(poVar1,"(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,lineNo);
    std::operator<<(poVar1,")");
    std::operator<<(local_1a0,(char *)":");
    std::operator<<(local_1a0," ");
    local_2c8._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
    local_2c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)&local_2c8,0x1000);
    local_278 = local_268;
    local_280 = &logMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    local_288 = 0x3000000028;
    vsnprintf(local_2c8._M_impl.super__Vector_impl_data._M_start,0x1000,format,&local_288);
    std::__cxx11::stringbuf::str();
    syslog(loglevel,"%s%s",local_2a8[0],local_2c8._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::~string((string *)local_2a8);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_2c8);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return;
}

Assistant:

void softHSMLog(const int loglevel, const char* functionName, const char* fileName, const int lineNo, const char* format, ...)
{
	if (loglevel > softLogLevel) return;

	std::stringstream prepend;

#ifdef SOFTHSM_LOG_FILE_AND_LINE
	prepend << fileName << "(" << lineNo << ")";
#ifndef SOFTHSM_LOG_FUNCTION_NAME
	(void) functionName;
	prepend << ":";
#endif // !SOFTHSM_LOG_FUNCTION_NAME
	prepend << " ";
#endif // SOFTHSM_LOG_FILE_AND_LINE

#ifdef SOFTHSM_LOG_FUNCTION_NAME
	prepend << functionName << ": ";
#endif // SOFTHSM_LOG_FUNCTION_NAME

	// Print the format to a log message
	std::vector<char> logMessage;
	va_list args;

	logMessage.resize(4096);

	va_start(args, format);
	vsnprintf(&logMessage[0], 4096, format, args);
	va_end(args);

	// And log it
	syslog(loglevel, "%s%s", prepend.str().c_str(), &logMessage[0]);

#ifdef DEBUG_LOG_STDERR
	fprintf(stderr, "%s%s\n", prepend.str().c_str(), &logMessage[0]);
	fflush(stderr);
#endif // DEBUG_LOG_STDERR
}